

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void bhdct_dictionary_initialization
               (planck_unit_test_t *tc,ion_dictionary_handler_t *handler,ion_dictionary_t *dict,
               ion_key_type_t key_type,ion_key_size_t key_size,ion_value_size_t value_size,
               ion_dictionary_size_t dictionary_size)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  
  iVar1 = ion_master_table_create_dictionary
                    (handler,dict,key_type,key_size,value_size,dictionary_size);
  pVar2 = planck_unit_assert_int_are_equal
                    (tc,0,(int)iVar1,0x51,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                    );
  if (pVar2 != '\0') {
    pVar2 = planck_unit_assert_int_are_equal
                      (tc,key_type,dict->instance->key_type,0x53,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                      );
    if (pVar2 != '\0') {
      pVar2 = planck_unit_assert_int_are_equal
                        (tc,key_size,(dict->instance->record).key_size,0x54,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                        );
      if (pVar2 != '\0') {
        pVar2 = planck_unit_assert_int_are_equal
                          (tc,value_size,(dict->instance->record).value_size,0x55,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                          );
        if (pVar2 != '\0') {
          return;
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
bhdct_dictionary_initialization(
	planck_unit_test_t			*tc,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dict,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size
) {
	ion_err_t err = ion_master_table_create_dictionary(handler, dict, key_type, key_size, value_size, dictionary_size);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, err);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key_type, dict->instance->key_type);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key_size, dict->instance->record.key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, value_size, dict->instance->record.value_size);
}